

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkRwtSetSV(ARKodeMem ark_mem,N_Vector My,N_Vector weight)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  double dVar1;
  int local_4;
  
  N_VAbs(in_RSI,*(undefined8 *)(in_RDI + 0x268));
  N_VLinearSum(*(undefined8 *)(in_RDI + 0x20),0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x268),
               *(undefined8 *)(in_RDI + 0x48),*(undefined8 *)(in_RDI + 0x268));
  if ((*(int *)(in_RDI + 0x50) == 0) ||
     (dVar1 = (double)N_VMin(*(undefined8 *)(in_RDI + 0x268)), 0.0 < dVar1)) {
    N_VInv(*(undefined8 *)(in_RDI + 0x268),in_RDX);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int arkRwtSetSV(ARKodeMem ark_mem, N_Vector My, N_Vector weight)
{
  N_VAbs(My, ark_mem->tempv1);
  N_VLinearSum(ark_mem->reltol, ark_mem->tempv1, ONE, ark_mem->VRabstol,
               ark_mem->tempv1);
  if (ark_mem->Ratolmin0)
  {
    if (N_VMin(ark_mem->tempv1) <= ZERO) { return (-1); }
  }
  N_VInv(ark_mem->tempv1, weight);
  return (0);
}